

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_uint32 ma_dr_mp3_bs_get_bits(ma_dr_mp3_bs *bs,int n)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  
  uVar1 = bs->pos;
  bs->pos = uVar1 + n;
  uVar6 = 0;
  if ((int)(uVar1 + n) <= bs->limit) {
    pbVar5 = bs->buf + ((int)uVar1 >> 3);
    uVar2 = 0xffU >> (sbyte)(uVar1 & 7) & (uint)*pbVar5;
    uVar6 = 0;
    iVar4 = (uVar1 & 7) + n;
    while( true ) {
      pbVar5 = pbVar5 + 1;
      bVar3 = (byte)(iVar4 + -8);
      if (iVar4 < 9) break;
      uVar6 = uVar6 | uVar2 << (bVar3 & 0x1f);
      uVar2 = (uint)*pbVar5;
      iVar4 = iVar4 + -8;
    }
    uVar6 = uVar2 >> (-bVar3 & 0x1f) | uVar6;
  }
  return uVar6;
}

Assistant:

static ma_uint32 ma_dr_mp3_bs_get_bits(ma_dr_mp3_bs *bs, int n)
{
    ma_uint32 next, cache = 0, s = bs->pos & 7;
    int shl = n + s;
    const ma_uint8 *p = bs->buf + (bs->pos >> 3);
    if ((bs->pos += n) > bs->limit)
        return 0;
    next = *p++ & (255 >> s);
    while ((shl -= 8) > 0)
    {
        cache |= next << shl;
        next = *p++;
    }
    return cache | (next >> -shl);
}